

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduce.hpp
# Opt level: O0

void __thiscall
diy::ReduceProxy::ReduceProxy
          (ReduceProxy *this,Proxy *proxy,void *block,uint round,Assigner *assigner,
          GIDVector *incoming_gids,GIDVector *outgoing_gids)

{
  undefined4 uVar1;
  size_type sVar2;
  const_reference pvVar3;
  undefined4 in_ECX;
  undefined8 in_RDX;
  long in_RDI;
  long *in_R8;
  vector<int,_std::allocator<int>_> *in_R9;
  vector<int,_std::allocator<int>_> *in_stack_00000008;
  BlockID nbr_1;
  uint i_1;
  BlockID nbr;
  uint i;
  Proxy *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  undefined4 local_50;
  undefined4 local_34;
  
  Master::Proxy::Proxy
            ((Proxy *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             in_stack_ffffffffffffff68);
  *(undefined8 *)(in_RDI + 0x90) = in_RDX;
  *(undefined4 *)(in_RDI + 0x98) = in_ECX;
  *(long **)(in_RDI + 0xa0) = in_R8;
  Link::Link((Link *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  Link::Link((Link *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  local_34 = 0;
  while( true ) {
    sVar2 = std::vector<int,_std::allocator<int>_>::size(in_R9);
    if (sVar2 <= local_34) break;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](in_R9,(ulong)local_34);
    (**(code **)(*in_R8 + 0x18))(in_R8,*pvVar3);
    Link::add_neighbor((Link *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                       (BlockID *)in_stack_ffffffffffffff68);
    local_34 = local_34 + 1;
  }
  local_50 = 0;
  while( true ) {
    sVar2 = std::vector<int,_std::allocator<int>_>::size(in_stack_00000008);
    if (sVar2 <= local_50) break;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](in_stack_00000008,(ulong)local_50);
    uVar1 = (**(code **)(*in_R8 + 0x18))(in_R8,*pvVar3);
    Link::add_neighbor((Link *)CONCAT44(uVar1,in_stack_ffffffffffffff70),
                       (BlockID *)in_stack_ffffffffffffff68);
    local_50 = local_50 + 1;
  }
  return;
}

Assistant:

ReduceProxy(Master::Proxy&&         proxy, //!< parent proxy
                void*                   block, //!< diy block
                unsigned                round, //!< current round
                const Assigner&         assigner, //!< assigner
                const GIDVector&        incoming_gids, //!< incoming gids in this group
                const GIDVector&        outgoing_gids): //!< outgoing gids in this group
      Master::Proxy(std::move(proxy)),
      block_(block),
      round_(round),
      assigner_(assigner)
    {
      // setup in_link
      for (unsigned i = 0; i < incoming_gids.size(); ++i)
      {
        BlockID nbr;
        nbr.gid  = incoming_gids[i];
        nbr.proc = assigner.rank(nbr.gid);
        in_link_.add_neighbor(nbr);
      }

      // setup out_link
      for (unsigned i = 0; i < outgoing_gids.size(); ++i)
      {
        BlockID nbr;
        nbr.gid  = outgoing_gids[i];
        nbr.proc = assigner.rank(nbr.gid);
        out_link_.add_neighbor(nbr);
      }
    }